

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall IteratorTest::accessIteratorOperations<true>(IteratorTest *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar4;
  reference piVar5;
  logic_error *plVar6;
  code *pcVar7;
  undefined *puVar8;
  long lVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  Iterator<TestType,_true,_std::allocator<unsigned_long>_> it;
  View<TestType,_true,_std::allocator<unsigned_long>_> v_3;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  undefined1 local_188 [24];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_170;
  undefined1 local_158 [8];
  pointer pTStack_150;
  undefined1 local_148 [16];
  undefined1 local_138 [32];
  Iterator<TestType,_false,_std::allocator<unsigned_long>_> local_118;
  undefined1 local_e8 [8];
  long local_e0;
  size_t *local_d8;
  size_t local_c0;
  size_t local_b8;
  
  _Var3._M_current = (unsigned_long *)operator_new(8);
  *_Var3._M_current = 0x18;
  local_e8 = (undefined1  [8])this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)&local_e0,_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_158);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
  local_138._0_16_ = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  _local_158 = (undefined1  [16])0x0;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
  uVar1 = local_148._8_8_;
  pTStack_150 = (pointer)local_188._8_8_;
  local_158 = (undefined1  [8])local_188._0_8_;
  uVar2 = local_138._8_8_;
  local_148._8_8_ =
       local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_148._0_8_ = local_188._16_8_;
  local_138._8_8_ =
       local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_138._0_8_ =
       local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,uVar2 - uVar1);
    if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_170.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_170.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  lVar9 = 0;
  do {
    if ((local_158 == (undefined1  [8])0x0) ||
       ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= (ulong)local_148._0_8_)) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
      pcVar7 = std::runtime_error::~runtime_error;
      puVar8 = &std::runtime_error::typeinfo;
LAB_001c2f6c:
      __cxa_throw(plVar6,puVar8,pcVar7);
    }
    if (*(int *)pTStack_150 != this->data_[lVar9]) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"test failed.");
      pcVar7 = std::logic_error::~logic_error;
      puVar8 = &std::logic_error::typeinfo;
      goto LAB_001c2f6c;
    }
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x18);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,local_b8);
  if (local_158 == (undefined1  [8])0x0) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
  }
  else {
    if ((undefined1  [8])local_188._0_8_ == local_158) {
      if (local_148._0_8_ != local_188._16_8_) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"test failed.");
        pcVar7 = std::logic_error::~logic_error;
        puVar8 = &std::logic_error::typeinfo;
        goto LAB_001c32f5;
      }
      if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_170.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_170.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pIVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                         ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
      if ((pIVar4->view_ == (view_pointer)0x0) ||
         ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
        pcVar7 = std::runtime_error::~runtime_error;
        puVar8 = &std::runtime_error::typeinfo;
LAB_001c3327:
        __cxa_throw(plVar6,puVar8,pcVar7);
      }
      if (*pIVar4->pointer_ != 0x2e) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"test failed.");
        pcVar7 = std::logic_error::~logic_error;
        puVar8 = &std::logic_error::typeinfo;
        goto LAB_001c3327;
      }
      if ((pointer)local_148._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_148._8_8_,local_138._8_8_ - local_148._8_8_);
      }
      operator_delete(local_d8,local_c0 * 0x18);
      operator_delete(_Var3._M_current,8);
      _Var3._M_current = (unsigned_long *)operator_new(8);
      *_Var3._M_current = 0x18;
      local_e8 = (undefined1  [8])this;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)&local_e0,_Var3,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                 (allocator_type *)local_158);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
      local_138._0_16_ = (undefined1  [16])0x0;
      local_148 = (undefined1  [16])0x0;
      _local_158 = (undefined1  [16])0x0;
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188,
                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
      uVar1 = local_148._8_8_;
      pTStack_150 = (pointer)local_188._8_8_;
      local_158 = (undefined1  [8])local_188._0_8_;
      uVar2 = local_138._8_8_;
      local_148._8_8_ =
           local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_148._0_8_ = local_188._16_8_;
      local_138._8_8_ =
           local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_138._0_8_ =
           local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pointer)uVar1 != (pointer)0x0) {
        operator_delete((void *)uVar1,uVar2 - uVar1);
        if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      lVar9 = 0;
      do {
        if ((local_158 == (undefined1  [8])0x0) ||
           ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= (ulong)local_148._0_8_)) {
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
          pcVar7 = std::runtime_error::~runtime_error;
          puVar8 = &std::runtime_error::typeinfo;
LAB_001c2f9e:
          __cxa_throw(plVar6,puVar8,pcVar7);
        }
        if (*(int *)pTStack_150 != this->data_[lVar9]) {
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar6,"test failed.");
          pcVar7 = std::logic_error::~logic_error;
          puVar8 = &std::logic_error::typeinfo;
          goto LAB_001c2f9e;
        }
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x18);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188,
                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,local_b8);
      if (local_158 == (undefined1  [8])0x0) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
      }
      else {
        if ((undefined1  [8])local_188._0_8_ == local_158) {
          if (local_148._0_8_ != local_188._16_8_) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar6,"test failed.");
            pcVar7 = std::logic_error::~logic_error;
            puVar8 = &std::logic_error::typeinfo;
            goto LAB_001c33a3;
          }
          if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_170.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_170.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_170.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pIVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                             ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
          if ((pIVar4->view_ == (view_pointer)0x0) ||
             ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
            pcVar7 = std::runtime_error::~runtime_error;
            puVar8 = &std::runtime_error::typeinfo;
LAB_001c33d5:
            __cxa_throw(plVar6,puVar8,pcVar7);
          }
          if (*pIVar4->pointer_ != 0x2e) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar6,"test failed.");
            pcVar7 = std::logic_error::~logic_error;
            puVar8 = &std::logic_error::typeinfo;
            goto LAB_001c33d5;
          }
          if ((pointer)local_148._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_148._8_8_,local_138._8_8_ - local_148._8_8_);
          }
          operator_delete(local_d8,local_c0 * 0x18);
          operator_delete(_Var3._M_current,8);
          _Var3._M_current = (unsigned_long *)operator_new(8);
          *_Var3._M_current = 0x18;
          local_e8 = (undefined1  [8])this;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)&local_e0,_Var3,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                     (allocator_type *)local_158);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
          local_138._0_16_ = (undefined1  [16])0x0;
          local_148 = (undefined1  [16])0x0;
          _local_158 = (undefined1  [16])0x0;
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                    ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_118,
                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,0);
          local_188._0_8_ = local_118.view_;
          local_188._8_8_ = local_118.pointer_;
          local_188._16_8_ = local_118.index_;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_170,&local_118.coordinates_);
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188);
          uVar1 = local_148._8_8_;
          pTStack_150 = (pointer)local_188._8_8_;
          local_158 = (undefined1  [8])local_188._0_8_;
          uVar2 = local_138._8_8_;
          local_148._8_8_ =
               local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_148._0_8_ = local_188._16_8_;
          local_138._8_8_ =
               local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_138._0_8_ =
               local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((pointer)uVar1 != (pointer)0x0) {
            operator_delete((void *)uVar1,uVar2 - uVar1);
            if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_170.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_170.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_170.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if (local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_118.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_118.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar9 = 0;
          do {
            if ((local_158 == (undefined1  [8])0x0) ||
               ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= (ulong)local_148._0_8_)
               ) {
              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
              pcVar7 = std::runtime_error::~runtime_error;
              puVar8 = &std::runtime_error::typeinfo;
LAB_001c2fd0:
              __cxa_throw(plVar6,puVar8,pcVar7);
            }
            if (*(int *)pTStack_150 != this->data_[lVar9]) {
              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar6,"test failed.");
              pcVar7 = std::logic_error::~logic_error;
              puVar8 = &std::logic_error::typeinfo;
              goto LAB_001c2fd0;
            }
            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x18);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                    ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_188,
                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,local_b8);
          if (local_158 == (undefined1  [8])0x0) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
          }
          else {
            if ((undefined1  [8])local_188._0_8_ == local_158) {
              if (local_148._0_8_ != local_188._16_8_) {
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar6,"test failed.");
                pcVar7 = std::logic_error::~logic_error;
                puVar8 = &std::logic_error::typeinfo;
                goto LAB_001c3451;
              }
              if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              pIVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                 ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
              if ((pIVar4->view_ == (view_pointer)0x0) ||
                 ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                pcVar7 = std::runtime_error::~runtime_error;
                puVar8 = &std::runtime_error::typeinfo;
LAB_001c3483:
                __cxa_throw(plVar6,puVar8,pcVar7);
              }
              if (*pIVar4->pointer_ != 0x2e) {
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar6,"test failed.");
                pcVar7 = std::logic_error::~logic_error;
                puVar8 = &std::logic_error::typeinfo;
                goto LAB_001c3483;
              }
              if ((pointer)local_148._8_8_ != (pointer)0x0) {
                operator_delete((void *)local_148._8_8_,local_138._8_8_ - local_148._8_8_);
              }
              operator_delete(local_d8,local_c0 * 0x18);
              operator_delete(_Var3._M_current,8);
              lVar11 = 0;
              lVar12 = 1;
              lVar9 = 0;
              do {
                *(long *)(local_e8 + lVar9 * 8) = lVar11;
                (&local_e0)[lVar9] = lVar12;
                lVar9 = lVar9 + 2;
                lVar11 = lVar11 + 2;
                lVar12 = lVar12 + 2;
              } while (lVar9 != 0x18);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_158 = (undefined1  [8])local_e8;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_158 + 8),_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)local_188);
              andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_188,
                         (View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158,0);
              sVar10 = 0;
              do {
                if (((view_pointer)local_188._0_8_ == (view_pointer)0x0) ||
                   ((size_t *)((geometry_type *)(local_188._0_8_ + 8))->size_ <=
                    (ulong)local_188._16_8_)) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  pcVar7 = std::runtime_error::~runtime_error;
                  puVar8 = &std::runtime_error::typeinfo;
LAB_001c3002:
                  __cxa_throw(plVar6,puVar8,pcVar7);
                }
                if (sVar10 != *(size_t *)local_188._8_8_) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar7 = std::logic_error::~logic_error;
                  puVar8 = &std::logic_error::typeinfo;
                  goto LAB_001c3002;
                }
                andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
                          ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_188);
                sVar10 = sVar10 + 1;
              } while (sVar10 != 0x18);
              if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete((void *)local_148._0_8_,local_138._8_8_ * 0x18);
              operator_delete(_Var3._M_current,8);
              lVar11 = 0;
              lVar12 = 1;
              lVar9 = 0;
              do {
                *(long *)(local_e8 + lVar9 * 8) = lVar11;
                (&local_e0)[lVar9] = lVar12;
                lVar9 = lVar9 + 2;
                lVar11 = lVar11 + 2;
                lVar12 = lVar12 + 2;
              } while (lVar9 != 0x18);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_158 + 8),_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)local_188);
              andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_188,
                         (View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158,0);
              sVar10 = 0;
              do {
                if (((view_pointer)local_188._0_8_ == (view_pointer)0x0) ||
                   ((size_t *)((geometry_type *)(local_188._0_8_ + 8))->size_ <=
                    (ulong)local_188._16_8_)) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  pcVar7 = std::runtime_error::~runtime_error;
                  puVar8 = &std::runtime_error::typeinfo;
LAB_001c3034:
                  __cxa_throw(plVar6,puVar8,pcVar7);
                }
                if (sVar10 != *(size_t *)local_188._8_8_) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar7 = std::logic_error::~logic_error;
                  puVar8 = &std::logic_error::typeinfo;
                  goto LAB_001c3034;
                }
                andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
                          ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_188);
                sVar10 = sVar10 + 1;
              } while (sVar10 != 0x18);
              if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete((void *)local_148._0_8_,local_138._8_8_ * 0x18);
              operator_delete(_Var3._M_current,8);
              lVar11 = 0;
              lVar12 = 1;
              lVar9 = 0;
              do {
                *(long *)(local_e8 + lVar9 * 8) = lVar11;
                (&local_e0)[lVar9] = lVar12;
                lVar9 = lVar9 + 2;
                lVar11 = lVar11 + 2;
                lVar12 = lVar12 + 2;
              } while (lVar9 != 0x18);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_158 + 8),_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)local_188);
              andres::View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_118,
                         (View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158,0);
              local_188._0_8_ = local_118.view_;
              local_188._8_8_ = local_118.pointer_;
              local_188._16_8_ = local_118.index_;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_170,&local_118.coordinates_);
              andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_188);
              if (local_118.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_118.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_118.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_118.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              sVar10 = 0;
              do {
                if (((view_pointer)local_188._0_8_ == (view_pointer)0x0) ||
                   ((size_t *)((geometry_type *)(local_188._0_8_ + 8))->size_ <=
                    (ulong)local_188._16_8_)) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  pcVar7 = std::runtime_error::~runtime_error;
                  puVar8 = &std::runtime_error::typeinfo;
LAB_001c3066:
                  __cxa_throw(plVar6,puVar8,pcVar7);
                }
                if (sVar10 != *(size_t *)local_188._8_8_) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar7 = std::logic_error::~logic_error;
                  puVar8 = &std::logic_error::typeinfo;
                  goto LAB_001c3066;
                }
                andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
                          ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_188);
                sVar10 = sVar10 + 1;
              } while (sVar10 != 0x18);
              if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete((void *)local_148._0_8_,local_138._8_8_ * 0x18);
              operator_delete(_Var3._M_current,8);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_e8 = (undefined1  [8])this;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)&local_e0,_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)local_158);
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
              local_138._0_16_ = (undefined1  [16])0x0;
              local_148 = (undefined1  [16])0x0;
              _local_158 = (undefined1  [16])0x0;
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188,
                         (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
              uVar1 = local_148._8_8_;
              pTStack_150 = (pointer)local_188._8_8_;
              local_158 = (undefined1  [8])local_188._0_8_;
              uVar2 = local_138._8_8_;
              local_148._8_8_ =
                   local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              local_148._0_8_ = local_188._16_8_;
              local_138._8_8_ =
                   local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_138._0_8_ =
                   local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if ((pointer)uVar1 != (pointer)0x0) {
                operator_delete((void *)uVar1,uVar2 - uVar1);
                if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_170.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_170.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_170.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              lVar9 = 0;
              do {
                if ((local_158 == (undefined1  [8])0x0) ||
                   (((geometry_type *)((long)local_158 + 8))->size_ <=
                    (ulong)(local_148._0_8_ + lVar9))) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  pcVar7 = std::runtime_error::~runtime_error;
                  puVar8 = &std::runtime_error::typeinfo;
LAB_001c3098:
                  __cxa_throw(plVar6,puVar8,pcVar7);
                }
                piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                                   ((View<int,_true,_std::allocator<unsigned_long>_> *)local_158,
                                    local_148._0_8_ + lVar9);
                if (*piVar5 != this->data_[lVar9]) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar7 = std::logic_error::~logic_error;
                  puVar8 = &std::logic_error::typeinfo;
                  goto LAB_001c3098;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 != 0x18);
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188,
                         (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
              if (local_158 == (undefined1  [8])0x0) {
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
              }
              else {
                if ((undefined1  [8])local_188._0_8_ == local_158) {
                  if (local_148._0_8_ == local_188._16_8_) {
                    if (((geometry_type *)((long)local_158 + 8))->size_ <= local_148._0_8_ + 4) {
                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.")
                      ;
                      goto LAB_001c34e3;
                    }
                    piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_158
                                        ,local_148._0_8_ + 4);
                    if (*piVar5 == this->data_[4]) {
                      if ((local_158 == (undefined1  [8])0x0) ||
                         ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <=
                          (size_t *)(local_148._0_8_ + 0x10))) {
                        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar6,"Assertion failed.");
                        goto LAB_001c34e3;
                      }
                      piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                                         ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                          local_158,(size_t)(local_148._0_8_ + 0x10));
                      if (*piVar5 == this->data_[0x10]) {
                        if (local_170.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_170.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_170.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_170.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if ((pointer)local_148._8_8_ != (pointer)0x0) {
                          operator_delete((void *)local_148._8_8_,local_138._8_8_ - local_148._8_8_)
                          ;
                        }
                        operator_delete(local_d8,local_c0 * 0x18);
                        operator_delete(_Var3._M_current,8);
                        _Var3._M_current = (unsigned_long *)operator_new(8);
                        *_Var3._M_current = 0x18;
                        local_e8 = (undefined1  [8])this;
                        andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                        Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                  ((Geometry<std::allocator<unsigned_long>> *)&local_e0,_Var3,
                                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    )(_Var3._M_current + 1),&andres::defaultOrder,
                                   &andres::defaultOrder,(allocator_type *)local_158);
                        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
                        local_138._0_16_ = (undefined1  [16])0x0;
                        local_148 = (undefined1  [16])0x0;
                        _local_158 = (undefined1  [16])0x0;
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158)
                        ;
                        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188,
                                   (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
                        uVar1 = local_148._8_8_;
                        pTStack_150 = (pointer)local_188._8_8_;
                        local_158 = (undefined1  [8])local_188._0_8_;
                        uVar2 = local_138._8_8_;
                        local_148._8_8_ =
                             local_170.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                        local_148._0_8_ = local_188._16_8_;
                        local_138._8_8_ =
                             local_170.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                        local_138._0_8_ =
                             local_170.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                        local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        if ((pointer)uVar1 != (pointer)0x0) {
                          operator_delete((void *)uVar1,uVar2 - uVar1);
                          if (local_170.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_170.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_170.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_170.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                        }
                        lVar9 = 0;
                        do {
                          if ((local_158 == (undefined1  [8])0x0) ||
                             (((geometry_type *)((long)local_158 + 8))->size_ <=
                              (ulong)(local_148._0_8_ + lVar9))) {
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar6,"Assertion failed.");
                            pcVar7 = std::runtime_error::~runtime_error;
                            puVar8 = &std::runtime_error::typeinfo;
LAB_001c30ca:
                            __cxa_throw(plVar6,puVar8,pcVar7);
                          }
                          piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                   operator()((View<int,_true,_std::allocator<unsigned_long>_> *)
                                              local_158,local_148._0_8_ + lVar9);
                          if (*piVar5 != this->data_[lVar9]) {
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar6,"test failed.");
                            pcVar7 = std::logic_error::~logic_error;
                            puVar8 = &std::logic_error::typeinfo;
                            goto LAB_001c30ca;
                          }
                          lVar9 = lVar9 + 1;
                        } while (lVar9 != 0x18);
                        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188,
                                   (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
                        if (local_158 == (undefined1  [8])0x0) {
                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar6,"Assertion failed.");
                        }
                        else {
                          if ((undefined1  [8])local_188._0_8_ == local_158) {
                            if (local_148._0_8_ == local_188._16_8_) {
                              if (((geometry_type *)((long)local_158 + 8))->size_ <=
                                  local_148._0_8_ + 4) {
                                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar6,"Assertion failed.");
                                goto LAB_001c3551;
                              }
                              piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                       operator()((View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_158,local_148._0_8_ + 4);
                              if (*piVar5 == this->data_[4]) {
                                if ((local_158 == (undefined1  [8])0x0) ||
                                   ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <=
                                    (size_t *)(local_148._0_8_ + 0x10))) {
                                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar6,"Assertion failed.");
                                  goto LAB_001c3551;
                                }
                                piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                         operator()((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_158,(size_t)(local_148._0_8_ + 0x10));
                                if (*piVar5 == this->data_[0x10]) {
                                  if (local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_170.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_170.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_170.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  if ((pointer)local_148._8_8_ != (pointer)0x0) {
                                    operator_delete((void *)local_148._8_8_,
                                                    local_138._8_8_ - local_148._8_8_);
                                  }
                                  operator_delete(local_d8,local_c0 * 0x18);
                                  operator_delete(_Var3._M_current,8);
                                  _Var3._M_current = (unsigned_long *)operator_new(8);
                                  *_Var3._M_current = 0x18;
                                  local_e8 = (undefined1  [8])this;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)&local_e0,
                                             _Var3,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)local_158);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  local_138._0_16_ = (undefined1  [16])0x0;
                                  local_148 = (undefined1  [16])0x0;
                                  _local_158 = (undefined1  [16])0x0;
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                 *)local_158);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                  Iterator((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                           &local_118,
                                           (View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_e8,0);
                                  local_188._0_8_ = local_118.view_;
                                  local_188._8_8_ = local_118.pointer_;
                                  local_188._16_8_ = local_118.index_;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            (&local_170,&local_118.coordinates_);
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                 *)local_188);
                                  uVar1 = local_148._8_8_;
                                  pTStack_150 = (pointer)local_188._8_8_;
                                  local_158 = (undefined1  [8])local_188._0_8_;
                                  uVar2 = local_138._8_8_;
                                  local_148._8_8_ =
                                       local_170.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                                  local_148._0_8_ = local_188._16_8_;
                                  local_138._8_8_ =
                                       local_170.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  local_138._0_8_ =
                                       local_170.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                                  local_170.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                  local_170.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                  local_170.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                  if ((pointer)uVar1 != (pointer)0x0) {
                                    operator_delete((void *)uVar1,uVar2 - uVar1);
                                    if (local_170.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                      operator_delete(local_170.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_170.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_170.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                    }
                                  }
                                  if (local_118.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_118.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_118.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_118.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  lVar9 = 0;
                                  do {
                                    if ((local_158 == (undefined1  [8])0x0) ||
                                       (((geometry_type *)((long)local_158 + 8))->size_ <=
                                        (ulong)(local_148._0_8_ + lVar9))) {
                                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error
                                                ((runtime_error *)plVar6,"Assertion failed.");
                                      pcVar7 = std::runtime_error::~runtime_error;
                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001c30fc:
                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                    }
                                    piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>
                                             ::operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_158,local_148._0_8_ + lVar9);
                                    if (*piVar5 != this->data_[lVar9]) {
                                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar6,"test failed.");
                                      pcVar7 = std::logic_error::~logic_error;
                                      puVar8 = &std::logic_error::typeinfo;
                                      goto LAB_001c30fc;
                                    }
                                    lVar9 = lVar9 + 1;
                                  } while (lVar9 != 0x18);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                  Iterator((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_188,
                                           (View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_e8,0);
                                  if (local_158 == (undefined1  [8])0x0) {
                                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar6,"Assertion failed.");
                                  }
                                  else {
                                    if ((undefined1  [8])local_188._0_8_ == local_158) {
                                      if (local_148._0_8_ == local_188._16_8_) {
                                        if (((geometry_type *)((long)local_158 + 8))->size_ <=
                                            local_148._0_8_ + 4) {
                                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar6,"Assertion failed.");
                                          goto LAB_001c35bf;
                                        }
                                        piVar5 = andres::
                                                 View<int,_true,_std::allocator<unsigned_long>_>::
                                                 operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_158,local_148._0_8_ + 4);
                                        if (*piVar5 == this->data_[4]) {
                                          if ((local_158 == (undefined1  [8])0x0) ||
                                             ((size_t *)
                                              ((geometry_type *)((long)local_158 + 8))->size_ <=
                                              (size_t *)(local_148._0_8_ + 0x10))) {
                                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar6,"Assertion failed.");
                                            goto LAB_001c35bf;
                                          }
                                          piVar5 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_158,(size_t)(local_148._0_8_ + 0x10));
                                          if (*piVar5 == this->data_[0x10]) {
                                            if (local_170.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_170.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_170.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_170.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            if ((pointer)local_148._8_8_ != (pointer)0x0) {
                                              operator_delete((void *)local_148._8_8_,
                                                              local_138._8_8_ - local_148._8_8_);
                                            }
                                            operator_delete(local_d8,local_c0 * 0x18);
                                            operator_delete(_Var3._M_current,8);
                                            return;
                                          }
                                        }
                                      }
                                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar6,"test failed.");
                                      pcVar7 = std::logic_error::~logic_error;
                                      puVar8 = &std::logic_error::typeinfo;
                                      goto LAB_001c35cd;
                                    }
                                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar6,"Assertion failed.");
                                  }
LAB_001c35bf:
                                  pcVar7 = std::runtime_error::~runtime_error;
                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001c35cd:
                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                }
                              }
                            }
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar6,"test failed.");
                            pcVar7 = std::logic_error::~logic_error;
                            puVar8 = &std::logic_error::typeinfo;
                            goto LAB_001c355f;
                          }
                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar6,"Assertion failed.");
                        }
LAB_001c3551:
                        pcVar7 = std::runtime_error::~runtime_error;
                        puVar8 = &std::runtime_error::typeinfo;
LAB_001c355f:
                        __cxa_throw(plVar6,puVar8,pcVar7);
                      }
                    }
                  }
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar7 = std::logic_error::~logic_error;
                  puVar8 = &std::logic_error::typeinfo;
                  goto LAB_001c34f1;
                }
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
              }
LAB_001c34e3:
              pcVar7 = std::runtime_error::~runtime_error;
              puVar8 = &std::runtime_error::typeinfo;
LAB_001c34f1:
              __cxa_throw(plVar6,puVar8,pcVar7);
            }
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
          }
          pcVar7 = std::runtime_error::~runtime_error;
          puVar8 = &std::runtime_error::typeinfo;
LAB_001c3451:
          __cxa_throw(plVar6,puVar8,pcVar7);
        }
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
      }
      pcVar7 = std::runtime_error::~runtime_error;
      puVar8 = &std::runtime_error::typeinfo;
LAB_001c33a3:
      __cxa_throw(plVar6,puVar8,pcVar7);
    }
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
  }
  pcVar7 = std::runtime_error::~runtime_error;
  puVar8 = &std::runtime_error::typeinfo;
LAB_001c32f5:
  __cxa_throw(plVar6,puVar8,pcVar7);
}

Assistant:

void IteratorTest::accessIteratorOperations() {
    // operator*
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator->
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<TestType, constTarget> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, constTarget> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<TestType, true> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, true> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<TestType, false> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, true> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    // operator[]
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
}